

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromise_p.h
# Opt level: O1

void __thiscall QtPromisePrivate::PromiseError::PromiseError<int>(PromiseError *this,int *value)

{
  void *__tmp;
  int *piVar1;
  
  (this->m_data)._M_exception_object = (void *)0x0;
  piVar1 = (int *)__cxa_allocate_exception(4);
  *piVar1 = *value;
  __cxa_throw(piVar1,&int::typeinfo,0);
}

Assistant:

PromiseError(const T& value)
    {
        try {
            throw value;
        } catch (...) {
            m_data = std::current_exception();
        }
    }